

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::add_module(CTcMake *this,CTcMakeModule *mod)

{
  CTcMakeModule *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    *(CTcMakeModule **)(in_RDI + 0x30) = in_RSI;
  }
  else {
    CTcMakeModule::set_next(*(CTcMakeModule **)(in_RDI + 0x38),in_RSI);
  }
  *(CTcMakeModule **)(in_RDI + 0x38) = in_RSI;
  CTcMakeModule::set_next(in_RSI,(CTcMakeModule *)0x0);
  return;
}

Assistant:

void CTcMake::add_module(CTcMakeModule *mod)
{
    /* add it at the end of our list */
    if (mod_tail_ != 0)
        mod_tail_->set_next(mod);
    else
        mod_head_ = mod;
    mod_tail_ = mod;
    mod->set_next(0);
}